

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_process_table_cell
              (MD_CTX *ctx,MD_BLOCKTYPE cell_type,MD_ALIGN align,MD_OFFSET beg,MD_OFFSET end)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint in_R8D;
  int ret;
  MD_BLOCK_TD_DETAIL det;
  MD_LINE line;
  bool local_2e;
  bool local_2d;
  short sVar2;
  uint in_stack_ffffffffffffffd4;
  uint uVar3;
  MD_SIZE n_lines;
  uint local_18;
  uint local_14;
  
  local_14 = in_ECX;
  while( true ) {
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 & 0xffffff;
    if (local_14 < in_R8D) {
      uVar3 = (uint)CONCAT12(1,(short)in_stack_ffffffffffffffd4);
      if ((*(char *)(*in_RDI + (ulong)local_14) != ' ') &&
         (uVar3 = (uint)CONCAT12(1,(short)in_stack_ffffffffffffffd4),
         *(char *)(*in_RDI + (ulong)local_14) != '\t')) {
        sVar2 = 0x100;
        if (*(char *)(*in_RDI + (ulong)local_14) != '\v') {
          sVar2 = (ushort)(*(char *)(*in_RDI + (ulong)local_14) == '\f') << 8;
        }
        uVar3 = (uint)CONCAT12((char)((ushort)sVar2 >> 8),sVar2);
      }
      in_stack_ffffffffffffffd4 = CONCAT13((char)(uVar3 >> 0x10),(int3)uVar3);
    }
    local_18 = in_R8D;
    if ((char)(in_stack_ffffffffffffffd4 >> 0x18) == '\0') break;
    local_14 = local_14 + 1;
  }
  while( true ) {
    n_lines = in_stack_ffffffffffffffd4 & 0xffffff00;
    if (local_14 < local_18) {
      local_2d = true;
      if ((*(char *)(*in_RDI + (ulong)(local_18 - 1)) != ' ') &&
         (local_2d = true, *(char *)(*in_RDI + (ulong)(local_18 - 1)) != '\t')) {
        local_2e = true;
        if (*(char *)(*in_RDI + (ulong)(local_18 - 1)) != '\v') {
          local_2e = *(char *)(*in_RDI + (ulong)(local_18 - 1)) == '\f';
        }
        local_2d = local_2e;
      }
      n_lines = CONCAT31((int3)(in_stack_ffffffffffffffd4 >> 8),local_2d);
    }
    if ((char)n_lines == '\0') break;
    local_18 = local_18 - 1;
    in_stack_ffffffffffffffd4 = n_lines;
  }
  iVar1 = (*(code *)in_RDI[3])(in_ESI,&stack0xffffffffffffffdc,in_RDI[10]);
  if (iVar1 == 0) {
    iVar1 = md_process_normal_block_contents
                      ((MD_CTX *)CONCAT44(local_18,local_14),(MD_LINE *)((ulong)in_EDX << 0x20),
                       n_lines);
    if (((-1 < iVar1) &&
        (iVar1 = (*(code *)in_RDI[4])(in_ESI,&stack0xffffffffffffffdc,in_RDI[10]), iVar1 != 0)) &&
       (in_RDI[8] != 0)) {
      (*(code *)in_RDI[8])("Aborted from leave_block() callback.",in_RDI[10]);
    }
  }
  else if (in_RDI[8] != 0) {
    (*(code *)in_RDI[8])("Aborted from enter_block() callback.",in_RDI[10]);
  }
  return iVar1;
}

Assistant:

static int
md_process_table_cell(MD_CTX* ctx, MD_BLOCKTYPE cell_type, MD_ALIGN align, OFF beg, OFF end)
{
    MD_LINE line;
    MD_BLOCK_TD_DETAIL det;
    int ret = 0;

    while(beg < end  &&  ISWHITESPACE(beg))
        beg++;
    while(end > beg  &&  ISWHITESPACE(end-1))
        end--;

    det.align = align;
    line.beg = beg;
    line.end = end;

    MD_ENTER_BLOCK(cell_type, &det);
    MD_CHECK(md_process_normal_block_contents(ctx, &line, 1));
    MD_LEAVE_BLOCK(cell_type, &det);

abort:
    return ret;
}